

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

bool protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set
               (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,int32_t key,
               protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *val,upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map;
  int32_t key_local;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *val_local;
  upb_MiniTableField field;
  
  field.number_dont_copy_me__upb_internal_use_only = 0x67;
  field.offset_dont_copy_me__upb_internal_use_only = 0x370;
  field.presence = 0;
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0x18;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc0;
  key_local = key;
  val_local = val;
  map = _upb_Message_GetOrCreateMutableMap
                  (&msg->base_dont_copy_me__upb_internal_use_only,&field,4,8,a);
  uVar1 = _upb_Map_Insert(map,&key_local,4,&val_local,8,a);
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set(protobuf_test_messages_proto2_TestAllTypesProto2* msg, int32_t key, protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* val, upb_Arena* a) {
  const upb_MiniTableField field = {103, UPB_SIZE(336, 880), 0, 24, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__MapInt32NestedMessageEntry_msg_init);
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, sizeof(key), sizeof(val), a);
  return _upb_Map_Insert(map, &key, sizeof(key), &val, sizeof(val), a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}